

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O2

QString * __thiscall
Win32MakefileGenerator::escapeFilePath
          (QString *__return_storage_ptr__,Win32MakefileGenerator *this,QString *path)

{
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  QString *pQVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&path->d);
  if ((__return_storage_ptr__->d).size == 0) goto LAB_001e0596;
  bVar3 = QString::contains(__return_storage_ptr__,(QChar)0x20,CaseSensitive);
  if (bVar3) {
LAB_001e04de:
    local_60.d = (Data *)0x2236a5;
    local_60.size = 0x2236a5;
    local_60.ptr = (char *)__return_storage_ptr__;
    QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>::
    convertTo<QString>((QString *)&local_48,
                       (QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>
                        *)&local_60);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar5 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar5;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  else {
    bVar3 = QString::contains(__return_storage_ptr__,(QChar)0x9,CaseSensitive);
    if (bVar3) goto LAB_001e04de;
  }
  if (Option::debug_level != 0) {
    QString::toLatin1_helper((QString *)&local_48);
    pcVar5 = local_48.ptr;
    if (local_48.ptr == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&local_60);
    pQVar4 = (QString *)local_60.ptr;
    if ((QString *)local_60.ptr == (QString *)0x0) {
      pQVar4 = (QString *)&QByteArray::_empty;
    }
    debug_msg_internal(2,"EscapeFilePath: %s -> %s",pcVar5,pQVar4);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
  }
LAB_001e0596:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeFilePath(const QString &path) const
{
    QString ret = path;
    if(!ret.isEmpty()) {
        if (ret.contains(' ') || ret.contains('\t'))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeFilePath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}